

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy.c
# Opt level: O0

void ccopy_(integer *n,singlecomplex *cx,integer *incx,singlecomplex *cy,integer *incy)

{
  int local_3c;
  int local_38;
  integer iy;
  integer ix;
  integer i;
  integer *incy_local;
  singlecomplex *cy_local;
  integer *incx_local;
  singlecomplex *cx_local;
  integer *n_local;
  
  if (0 < *n) {
    if ((*incx == 1) && (*incy == 1)) {
      for (iy = 1; iy <= *n; iy = iy + 1) {
        cy[iy + -1].r = cx[iy + -1].r;
        cy[iy + -1].i = cx[iy + -1].i;
      }
    }
    else {
      local_38 = 1;
      local_3c = 1;
      if (*incx < 0) {
        local_38 = (1 - *n) * *incx + 1;
      }
      if (*incy < 0) {
        local_3c = (1 - *n) * *incy + 1;
      }
      for (iy = 1; iy <= *n; iy = iy + 1) {
        cy[local_3c + -1].r = cx[local_38 + -1].r;
        cy[local_3c + -1].i = cx[local_38 + -1].i;
        local_38 = *incx + local_38;
        local_3c = *incy + local_3c;
      }
    }
  }
  return;
}

Assistant:

void ccopy_(integer *n, singlecomplex *cx, integer *incx, singlecomplex *
	cy, integer *incy)
{


    /* System generated locals */


    /* Local variables */
    integer i, ix, iy;


/*     copies a vector, x, to a vector, y.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	CY(iy).r = CX(ix).r, CY(iy).i = CX(ix).i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	CY(i).r = CX(i).r, CY(i).i = CX(i).i;
/* L30: */
    }
    return;
}